

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O1

string * Bipartition::toStringVerbose
                   (string *__return_storage_ptr__,
                   dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *leaf2NumMap)

{
  string *psVar1;
  long lVar2;
  ulong uVar3;
  string toDisplay;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string *local_58;
  string local_50;
  
  local_78 = local_68;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  uVar3 = edge->m_num_bits;
  if (uVar3 != 0) {
    lVar2 = 8;
    do {
      uVar3 = uVar3 - 1;
      if (((edge->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        std::__cxx11::string::_M_append
                  ((char *)&local_78,
                   *(ulong *)((long)(leaf2NumMap->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar2 + -8));
        std::__cxx11::string::append((char *)&local_78);
      }
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_78 + local_70);
  lVar2 = std::__cxx11::string::find_last_not_of((char)&local_78,0x2c);
  psVar1 = local_58;
  Tools::substring(local_58,&local_50,0,lVar2 + 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return psVar1;
}

Assistant:

string Bipartition::toStringVerbose(boost::dynamic_bitset<> edge, vector<string> leaf2NumMap) {
    string toDisplay = "";
    size_t edge_size = edge.size();
    for (size_t i = 0; i < edge_size; i++) {
        if ((bool)edge[edge_size - i - 1]) {
            toDisplay += leaf2NumMap[i];
            toDisplay += ",";
        }
    }
    // remove the last ,
    return Tools::substring(toDisplay, 0, toDisplay.find_last_not_of(',')+1);
}